

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

i64 fts5IndexDataVersion(Fts5Index *p)

{
  sqlite3_stmt **ppStmt;
  int iVar1;
  Mem *pMem;
  i64 iVar2;
  char *zSql;
  sqlite3_stmt *psVar3;
  
  if (p->rc == 0) {
    ppStmt = &p->pDataVersion;
    psVar3 = p->pDataVersion;
    if (psVar3 == (sqlite3_stmt *)0x0) {
      zSql = sqlite3_mprintf("PRAGMA %Q.data_version",p->pConfig->zDb);
      iVar1 = fts5IndexPrepareStmt(p,ppStmt,zSql);
      p->rc = iVar1;
      if (iVar1 != 0) {
        return 0;
      }
      psVar3 = *ppStmt;
    }
    iVar1 = sqlite3_step(psVar3);
    if (iVar1 == 100) {
      psVar3 = *ppStmt;
      pMem = columnMem(psVar3,0);
      iVar2 = sqlite3VdbeIntValue(pMem);
      columnMallocFailure(psVar3);
    }
    else {
      iVar2 = 0;
    }
    iVar1 = sqlite3_reset(p->pDataVersion);
    p->rc = iVar1;
  }
  else {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static i64 fts5IndexDataVersion(Fts5Index *p){
  i64 iVersion = 0;

  if( p->rc==SQLITE_OK ){
    if( p->pDataVersion==0 ){
      p->rc = fts5IndexPrepareStmt(p, &p->pDataVersion,
          sqlite3_mprintf("PRAGMA %Q.data_version", p->pConfig->zDb)
          );
      if( p->rc ) return 0;
    }

    if( SQLITE_ROW==sqlite3_step(p->pDataVersion) ){
      iVersion = sqlite3_column_int64(p->pDataVersion, 0);
    }
    p->rc = sqlite3_reset(p->pDataVersion);
  }

  return iVersion;
}